

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_ironlich.cpp
# Opt level: O2

int AF_A_LichAttack(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  DAngle angle;
  double dVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  AActor *pAVar6;
  PClassActor *pPVar7;
  FState *newstate;
  AActor *pAVar8;
  FSoundID *sound_id;
  AActor *self;
  char *__assertion;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  FSoundID local_70;
  FSoundID local_6c;
  FName local_68;
  FName local_64;
  FSoundID local_60;
  FName local_5c;
  DVector3 local_58;
  undefined8 local_38;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0052e667;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_0052e657;
  self = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (self == (AActor *)0x0) goto LAB_0052e32b;
    bVar3 = DObject::IsKindOf((DObject *)self,AActor::RegistrationInfo.MyClass);
    if (!bVar3) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0052e667;
    }
  }
  else {
    if (self != (AActor *)0x0) goto LAB_0052e657;
LAB_0052e32b:
    self = (AActor *)0x0;
  }
  if (numparam == 1) goto LAB_0052e3ab;
  VVar1 = param[1].field_0.field_3.Type;
  if (VVar1 != 0xff) {
    if (VVar1 != '\x03') {
LAB_0052e657:
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_0052e667;
    }
    this = (DObject *)param[1].field_0.field_1.a;
    if (param[1].field_0.field_1.atag == 1) {
      if ((this != (DObject *)0x0) &&
         (bVar3 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass), !bVar3)) {
        __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_0052e667;
      }
    }
    else if (this != (DObject *)0x0) goto LAB_0052e657;
  }
  if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
     ((VVar1 == '\x03' &&
      ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_0052e3ab:
    pAVar6 = GC::ReadBarrier<AActor>((AActor **)&self->target);
    if (pAVar6 != (AActor *)0x0) {
      A_FaceTarget(self);
      bVar3 = AActor::CheckMeleeRange(self);
      if (bVar3) {
        iVar4 = FRandom::HitDice(&pr_atk,6);
        local_5c.Index = 0x84;
        local_38 = 0;
        angle.Degrees._4_4_ = extraout_XMM0_Db;
        angle.Degrees._0_4_ = extraout_XMM0_Da;
        iVar5 = P_DamageMobj(pAVar6,self,self,iVar4,&local_5c,0,angle);
        if (0 < iVar5) {
          iVar4 = iVar5;
        }
        P_TraceBleed(iVar4,pAVar6,self);
      }
      else {
        dVar2 = AActor::Distance2D(self,pAVar6,false);
        iVar4 = FRandom::operator()(&pr_atk);
        if (iVar4 < AF_A_LichAttack::atkResolve1[512.0 < dVar2]) {
          pPVar7 = PClass::FindActor("HeadFX1");
          P_SpawnMissile(self,pAVar6,pPVar7,(AActor *)0x0);
          iVar4 = S_FindSound("ironlich/attack2");
          sound_id = &local_60;
        }
        else {
          if (iVar4 < AF_A_LichAttack::atkResolve2[512.0 < dVar2]) {
            pPVar7 = PClass::FindActor("HeadFX3");
            pAVar6 = P_SpawnMissile(self,pAVar6,pPVar7,(AActor *)0x0);
            if (pAVar6 == (AActor *)0x0) {
              return 0;
            }
            FName::FName(&local_64,"NoGrow");
            newstate = AActor::FindState(pAVar6,&local_64);
            AActor::SetState(pAVar6,newstate,false);
            for (iVar4 = 2; iVar4 != 0xc; iVar4 = iVar4 + 2) {
              FName::FName(&local_68,"HeadFX3");
              local_58.X = (pAVar6->__Pos).X;
              local_58.Y = (pAVar6->__Pos).Y;
              local_58.Z = (pAVar6->__Pos).Z;
              pAVar8 = Spawn(&local_68,&local_58,ALLOW_REPLACE);
              if (iVar4 == 2) {
                local_70.ID = S_FindSound("ironlich/attack1");
                S_Sound(self,4,&local_70,1.0,1.0);
              }
              (pAVar8->target).field_0 = (pAVar6->target).field_0;
              (pAVar8->Angles).Yaw.Degrees = (pAVar6->Angles).Yaw.Degrees;
              (pAVar8->Vel).Z = (pAVar6->Vel).Z;
              dVar2 = (pAVar6->Vel).Y;
              (pAVar8->Vel).X = (pAVar6->Vel).X;
              (pAVar8->Vel).Y = dVar2;
              pAVar8->Damage = (VMFunction *)0x0;
              pAVar8->health = iVar4;
              P_CheckMissileSpawn(pAVar8,self->radius);
            }
            return 0;
          }
          pAVar8 = P_SpawnMissile(self,pAVar6,(PClassActor *)AWhirlwind::RegistrationInfo.MyClass,
                                  (AActor *)0x0);
          if (pAVar8 == (AActor *)0x0) {
            return 0;
          }
          (pAVar8->__Pos).Z = (pAVar8->__Pos).Z + -32.0;
          (pAVar8->tracer).field_0.p = pAVar6;
          pAVar8->health = 700;
          iVar4 = S_FindSound("ironlich/attack3");
          sound_id = &local_6c;
        }
        sound_id->ID = iVar4;
        S_Sound(self,4,sound_id,1.0,1.0);
      }
    }
    return 0;
  }
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
  ;
LAB_0052e667:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_heretic/a_ironlich.cpp"
                ,0x42,"int AF_A_LichAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_LichAttack)
{
	PARAM_ACTION_PROLOGUE;

	int i;
	AActor *fire;
	AActor *baseFire;
	AActor *mo;
	AActor *target;
	int randAttack;
	static const int atkResolve1[] = { 50, 150 };
	static const int atkResolve2[] = { 150, 200 };

	// Ice ball		(close 20% : far 60%)
	// Fire column	(close 40% : far 20%)
	// Whirlwind	(close 40% : far 20%)
	// Distance threshold = 8 cells

	target = self->target;
	if (target == NULL)
	{
		return 0;
	}
	A_FaceTarget (self);
	if (self->CheckMeleeRange ())
	{
		int damage = pr_atk.HitDice (6);
		int newdam = P_DamageMobj (target, self, self, damage, NAME_Melee);
		P_TraceBleed (newdam > 0 ? newdam : damage, target, self);
		return 0;
	}
	int dist = self->Distance2D(target) > 8 * 64;
	randAttack = pr_atk ();
	if (randAttack < atkResolve1[dist])
	{ // Ice ball
		P_SpawnMissile (self, target, PClass::FindActor("HeadFX1"));
		S_Sound (self, CHAN_BODY, "ironlich/attack2", 1, ATTN_NORM);
	}
	else if (randAttack < atkResolve2[dist])
	{ // Fire column
		baseFire = P_SpawnMissile (self, target, PClass::FindActor("HeadFX3"));
		if (baseFire != NULL)
		{
			baseFire->SetState (baseFire->FindState("NoGrow"));
			for (i = 0; i < 5; i++)
			{
				fire = Spawn("HeadFX3", baseFire->Pos(), ALLOW_REPLACE);
				if (i == 0)
				{
					S_Sound (self, CHAN_BODY, "ironlich/attack1", 1, ATTN_NORM);
				}
				fire->target = baseFire->target;
				fire->Angles.Yaw = baseFire->Angles.Yaw;
				fire->Vel = baseFire->Vel;
				fire->Damage = NULL;
				fire->health = (i+1) * 2;
				P_CheckMissileSpawn (fire, self->radius);
			}
		}
	}
	else
	{ // Whirlwind
		mo = P_SpawnMissile (self, target, RUNTIME_CLASS(AWhirlwind));
		if (mo != NULL)
		{
			mo->AddZ(-32);
			mo->tracer = target;
			mo->health = 20*TICRATE; // Duration
			S_Sound (self, CHAN_BODY, "ironlich/attack3", 1, ATTN_NORM);
		}
	}
	return 0;
}